

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

void jx9HashmapExtractNodeValue(jx9_hashmap_node *pNode,jx9_value *pValue,int bStore)

{
  int *piVar1;
  uint uVar2;
  sxu32 nSize;
  int iVar3;
  jx9_vm *pjVar4;
  jx9_hashmap *pMap;
  jx9_value *pSrc;
  
  pjVar4 = pNode->pMap->pVm;
  if (pNode->nValIdx < (pjVar4->aMemObj).nUsed) {
    pSrc = (jx9_value *)
           ((ulong)(pNode->nValIdx * (pjVar4->aMemObj).eSize) + (long)(pjVar4->aMemObj).pBase);
  }
  else {
    pSrc = (jx9_value *)0x0;
  }
  if (pSrc == (jx9_value *)0x0) {
    jx9MemObjRelease(pValue);
    return;
  }
  if (bStore != 0) {
    if ((pSrc->iFlags & 0x40) != 0) {
      piVar1 = (int *)((pSrc->x).iVal + 0x50);
      *piVar1 = *piVar1 + 1;
    }
    if ((pValue->iFlags & 0x40) == 0) {
      pMap = (jx9_hashmap *)0x0;
    }
    else {
      pMap = (jx9_hashmap *)(pValue->x).pOther;
    }
    SyMemcpy(pSrc,pValue,0x14);
    if ((pSrc->sBlob).nByte == 0) {
      if ((pValue->sBlob).nByte != 0) {
        SyBlobRelease(&pValue->sBlob);
      }
    }
    else {
      (pValue->sBlob).nByte = 0;
      uVar2 = (pValue->sBlob).nFlags;
      if ((uVar2 & 4) != 0) {
        (pValue->sBlob).pBlob = (void *)0x0;
        (pValue->sBlob).mByte = 0;
        (pValue->sBlob).nFlags = uVar2 & 0xfffffffb;
      }
      nSize = (pSrc->sBlob).nByte;
      if (nSize != 0) {
        SyBlobAppend(&pValue->sBlob,(pSrc->sBlob).pBlob,nSize);
      }
    }
    if ((pMap != (jx9_hashmap *)0x0) && (iVar3 = pMap->iRef, pMap->iRef = iVar3 + -1, iVar3 < 2)) {
      jx9HashmapRelease(pMap,1);
    }
    return;
  }
  jx9MemObjLoad(pSrc,pValue);
  return;
}

Assistant:

JX9_PRIVATE void jx9HashmapExtractNodeValue(jx9_hashmap_node *pNode, jx9_value *pValue, int bStore)
{
	jx9_value *pEntry = HashmapExtractNodeValue(pNode);
	if( pEntry ){
		if( bStore ){
			jx9MemObjStore(pEntry, pValue);
		}else{
			jx9MemObjLoad(pEntry, pValue);
		}
	}else{
		jx9MemObjRelease(pValue);
	}
}